

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs-event.c
# Opt level: O0

int run_test_fs_event_immediate_close(void)

{
  int iVar1;
  undefined8 uVar2;
  uv_loop_t *loop_00;
  int r;
  uv_loop_t *loop;
  uv_timer_t timer;
  
  uVar2 = uv_default_loop();
  iVar1 = uv_timer_init(uVar2,&loop);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs-event.c"
            ,0x36d,"r == 0");
    abort();
  }
  iVar1 = uv_timer_start(&loop,timer_cb,1,0);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs-event.c"
            ,0x370,"r == 0");
    abort();
  }
  uv_run(uVar2,0);
  if (close_cb_called != 2) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs-event.c"
            ,0x374,"close_cb_called == 2");
    abort();
  }
  loop_00 = (uv_loop_t *)uv_default_loop();
  close_loop(loop_00);
  uVar2 = uv_default_loop();
  iVar1 = uv_loop_close(uVar2);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs-event.c"
            ,0x376,"0 == uv_loop_close(uv_default_loop())");
    abort();
  }
  return 0;
}

Assistant:

TEST_IMPL(fs_event_immediate_close) {
#if defined(NO_FS_EVENTS)
  RETURN_SKIP(NO_FS_EVENTS);
#endif
  uv_timer_t timer;
  uv_loop_t* loop;
  int r;

  loop = uv_default_loop();

  r = uv_timer_init(loop, &timer);
  ASSERT(r == 0);

  r = uv_timer_start(&timer, timer_cb, 1, 0);
  ASSERT(r == 0);

  uv_run(loop, UV_RUN_DEFAULT);

  ASSERT(close_cb_called == 2);

  MAKE_VALGRIND_HAPPY();
  return 0;
}